

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall
CDirectiveHeaderSize::CDirectiveHeaderSize(CDirectiveHeaderSize *this,ArgumentList *args)

{
  bool bVar1;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CAssemblerCommand_00172b10;
  bVar1 = ConvertExpression(&((args->entries).
                              super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_start)->text,&this->headerSize);
  if (!bVar1) {
    Logger::printError<std::__cxx11::wstring>
              (FatalError,L"Invalid header size %s",
               &((args->entries).
                 super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_start)->text);
  }
  updateFile(this);
  return;
}

Assistant:

CDirectiveHeaderSize::CDirectiveHeaderSize(ArgumentList& args)
{
	if (ConvertExpression(args[0].text,headerSize) == false)
	{
		Logger::printError(Logger::FatalError,L"Invalid header size %s",args[0].text);
	}

	updateFile();
}